

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

STRING_HANDLE Map_ToJSON(MAP_HANDLE handle)

{
  bool bVar1;
  int iVar2;
  STRING_HANDLE handle_00;
  STRING_HANDLE s2;
  STRING_HANDLE s2_00;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  ulong uVar5;
  
  if (handle == (MAP_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar4 = "invalid arg (NULL)";
    handle_00 = (STRING_HANDLE)0x0;
    iVar2 = 0x262;
  }
  else {
    handle_00 = STRING_construct("{");
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return (STRING_HANDLE)0x0;
      }
      pcVar4 = "STRING_construct failed";
      handle_00 = (STRING_HANDLE)0x0;
      iVar2 = 0x26a;
    }
    else {
      if (handle->count == 0) {
        bVar1 = false;
      }
      else {
        uVar5 = 1;
        bVar1 = false;
        do {
          s2 = STRING_new_JSON(handle->keys[uVar5 - 1]);
          if (s2 == (STRING_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                        ,"Map_ToJSON",0x279,1,"STRING_new_JSON failed");
            }
            STRING_delete(handle_00);
            bVar1 = true;
            handle_00 = (STRING_HANDLE)0x0;
          }
          else {
            s2_00 = STRING_new_JSON(handle->values[uVar5 - 1]);
            if (s2_00 == (STRING_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                          ,"Map_ToJSON",0x283,1,"STRING_new_JSON failed");
              }
              STRING_delete(handle_00);
              bVar1 = true;
              handle_00 = (STRING_HANDLE)0x0;
            }
            else {
              if ((((uVar5 != 1) && (iVar2 = STRING_concat(handle_00,","), iVar2 != 0)) ||
                  (iVar2 = STRING_concat_with_STRING(handle_00,s2), iVar2 != 0)) ||
                 ((iVar2 = STRING_concat(handle_00,":"), iVar2 != 0 ||
                  (iVar2 = STRING_concat_with_STRING(handle_00,s2_00), iVar2 != 0)))) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                            ,"Map_ToJSON",0x291,1,"failed to build the JSON");
                }
                STRING_delete(handle_00);
                bVar1 = true;
                handle_00 = (STRING_HANDLE)0x0;
              }
              STRING_delete(s2_00);
            }
            STRING_delete(s2);
          }
        } while ((uVar5 < handle->count) && (uVar5 = uVar5 + 1, !bVar1));
      }
      if (!bVar1) {
        iVar2 = STRING_concat(handle_00,"}");
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                      ,"Map_ToJSON",0x2a8,1,"failed to build the JSON");
          }
          STRING_delete(handle_00);
          return (STRING_HANDLE)0x0;
        }
        return handle_00;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return handle_00;
      }
      pcVar4 = "error happened during JSON string builder";
      iVar2 = 0x2a2;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
            ,"Map_ToJSON",iVar2,1,pcVar4);
  return handle_00;
}

Assistant:

STRING_HANDLE Map_ToJSON(MAP_HANDLE handle)
{
    STRING_HANDLE result;
    /*Codes_SRS_MAP_02_052: [If parameter handle is NULL then Map_ToJSON shall return NULL.] */
    if (handle == NULL)
    {
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        /*Codes_SRS_MAP_02_048: [Map_ToJSON shall produce a STRING_HANDLE representing the content of the MAP.] */
        result = STRING_construct("{");
        if (result == NULL)
        {
            LogError("STRING_construct failed");
        }
        else
        {
            size_t i;
            MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA *)handle;
            /*Codes_SRS_MAP_02_049: [If the MAP is empty, then Map_ToJSON shall produce the string "{}".*/
            bool breakFor = false; /*used to break out of for*/
            for (i = 0; (i < handleData->count) && (!breakFor); i++)
            {
                /*add one entry to the JSON*/
                /*Codes_SRS_MAP_02_050: [If the map has properties then Map_ToJSON shall produce the following string:{"name1":"value1", "name2":"value2" ...}]*/
                STRING_HANDLE key = STRING_new_JSON(handleData->keys[i]);
                if (key == NULL)
                {
                    LogError("STRING_new_JSON failed");
                    STRING_delete(result);
                    result = NULL;
                    breakFor = true;
                }
                else
                {
                    STRING_HANDLE value = STRING_new_JSON(handleData->values[i]);
                    if (value == NULL)
                    {
                        LogError("STRING_new_JSON failed");
                        STRING_delete(result);
                        result = NULL;
                        breakFor = true;
                    }
                    else
                    {
                        if (!(
                            ((i>0) ? (STRING_concat(result, ",") == 0) : 1) &&
                            (STRING_concat_with_STRING(result, key) == 0) &&
                            (STRING_concat(result, ":") == 0) &&
                            (STRING_concat_with_STRING(result, value) == 0)
                            ))
                        {
                            LogError("failed to build the JSON");
                            STRING_delete(result);
                            result = NULL;
                            breakFor = true;
                        }
                        else
                        {
                            /*all nice, go to the next element in the map*/
                        }
                        STRING_delete(value);
                    }
                    STRING_delete(key);
                }
            }

            if (breakFor)
            {
                LogError("error happened during JSON string builder");
            }
            else
            {
                if (STRING_concat(result, "}") != 0)
                {
                    LogError("failed to build the JSON");
                    STRING_delete(result);
                    result = NULL;
                }
                else
                {
                    /*return as is, JSON has been build*/
                }
            }
        }
    }
    return result;

}